

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrashUtil.cpp
# Opt level: O0

void updateResidual(bool piecewise,HighsLp *lp,HighsSolution *sol,
                   vector<double,_std::allocator<double>_> *residual)

{
  double dVar1;
  double dVar2;
  const_reference pvVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RCX;
  long in_RDX;
  long in_RSI;
  byte in_DIL;
  double value;
  int row_1;
  int row;
  size_type in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  undefined8 local_38;
  undefined4 local_30;
  undefined4 local_2c;
  
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x749ca6);
  std::vector<double,_std::allocator<double>_>::assign
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(value_type_conflict1 *)0x749cc7);
  if ((in_DIL & 1) == 0) {
    for (local_2c = 0; local_2c < *(int *)(in_RSI + 4); local_2c = local_2c + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x68),(long)local_2c)
      ;
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x38),(long)local_2c)
      ;
      dVar2 = *pvVar3;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)local_2c);
      *pvVar4 = ABS(dVar1 - dVar2);
    }
  }
  else {
    for (local_30 = 0; local_30 < *(int *)(in_RSI + 4); local_30 = local_30 + 1) {
      local_38 = 0.0;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x38),(long)local_30)
      ;
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x50),(long)local_30)
      ;
      if (*pvVar3 < dVar1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x38),
                            (long)local_30);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x68),
                            (long)local_30);
        if (*pvVar3 <= dVar1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x38),
                              (long)local_30);
          local_38 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x68),
                              (long)local_30);
          local_38 = local_38 - *pvVar3;
        }
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x50),
                            (long)local_30);
        local_38 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x38),
                            (long)local_30);
        local_38 = local_38 - *pvVar3;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)local_30);
      *pvVar4 = local_38;
    }
  }
  return;
}

Assistant:

void updateResidual(bool piecewise, const HighsLp& lp, const HighsSolution& sol,
                    std::vector<double>& residual) {
  residual.clear();
  residual.assign(lp.num_row_, 0);

  if (!piecewise) {
    assert(isEqualityProblem(lp));
    for (int row = 0; row < lp.num_row_; row++)
      residual[row] = std::fabs(lp.row_upper_[row] - sol.row_value[row]);
  } else {
    // piecewise
    for (int row = 0; row < lp.num_row_; row++) {
      double value = 0;
      if (sol.row_value[row] <= lp.row_lower_[row])
        value = lp.row_lower_[row] - sol.row_value[row];
      else if (sol.row_value[row] >= lp.row_upper_[row])
        value = sol.row_value[row] - lp.row_upper_[row];

      residual[row] = value;
    }
  }
}